

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O2

Promise<void> __thiscall
capnp::_::TestMoreStuffImpl::neverReturn(TestMoreStuffImpl *this,NeverReturnContext context)

{
  CallContextHook *in_RDX;
  PromiseNode *extraout_RDX;
  Promise<void> PVar1;
  Promise<void> promise;
  CallContext<capnproto_test::capnp::test::TestMoreStuff::NeverReturnParams,_capnproto_test::capnp::test::TestMoreStuff::NeverReturnResults>
  local_b8;
  undefined1 local_b0 [24];
  Own<kj::_::PromiseNode> local_98;
  undefined1 local_80 [40];
  Reader local_58;
  Maybe<capnp::MessageSize> local_28;
  
  *(int *)context.hook[1]._vptr_CallContextHook = *(int *)context.hook[1]._vptr_CallContextHook + 1;
  local_b8.hook = in_RDX;
  kj::_::NeverDone::operator_cast_to_Promise((NeverDone *)local_b0);
  CallContext<capnproto_test::capnp::test::TestMoreStuff::NeverReturnParams,_capnproto_test::capnp::test::TestMoreStuff::NeverReturnResults>
  ::getParams(&local_58,&local_b8);
  capnproto_test::capnp::test::TestMoreStuff::NeverReturnParams::Reader::getCap
            ((Client *)local_80,&local_58);
  kj::Promise<void>::attach<capnproto_test::capnp::test::TestInterface::Client>
            ((Promise<void> *)&local_98,(Client *)local_b0);
  kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)(local_80 + 8));
  kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)local_b0);
  local_28.ptr.isSet = false;
  CallContext<capnproto_test::capnp::test::TestMoreStuff::NeverReturnParams,_capnproto_test::capnp::test::TestMoreStuff::NeverReturnResults>
  ::getResults((Builder *)local_80,&local_b8,&local_28);
  CallContext<capnproto_test::capnp::test::TestMoreStuff::NeverReturnParams,_capnproto_test::capnp::test::TestMoreStuff::NeverReturnResults>
  ::getParams(&local_58,&local_b8);
  capnproto_test::capnp::test::TestMoreStuff::NeverReturnParams::Reader::getCap
            ((Client *)local_b0,&local_58);
  capnproto_test::capnp::test::TestMoreStuff::NeverReturnResults::Builder::setCapCopy
            ((Builder *)local_80,(Client *)local_b0);
  kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)(local_b0 + 8));
  (*(local_b8.hook)->_vptr_CallContextHook[4])();
  *(Disposer **)&this->super_Server = local_98.disposer;
  *(PromiseNode **)&(this->super_Server).field_0x8 = local_98.ptr;
  local_98.ptr = (PromiseNode *)0x0;
  kj::Own<kj::_::PromiseNode>::dispose(&local_98);
  PVar1.super_PromiseBase.node.ptr = extraout_RDX;
  PVar1.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar1.super_PromiseBase.node;
}

Assistant:

kj::Promise<void> TestMoreStuffImpl::neverReturn(NeverReturnContext context) {
  ++callCount;

  // Attach `cap` to the promise to make sure it is released.
  auto promise = kj::Promise<void>(kj::NEVER_DONE).attach(context.getParams().getCap());

  // Also attach `cap` to the result struct to make sure that is released.
  context.getResults().setCapCopy(context.getParams().getCap());

  context.allowCancellation();
  return kj::mv(promise);
}